

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O2

bool __thiscall
leveldb::InternalFilterPolicy::KeyMayMatch(InternalFilterPolicy *this,Slice *key,Slice *f)

{
  FilterPolicy *pFVar1;
  int iVar2;
  long in_FS_OFFSET;
  Slice local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar1 = this->user_policy_;
  local_28 = ExtractUserKey(key);
  iVar2 = (*pFVar1->_vptr_FilterPolicy[4])(pFVar1,&local_28,f);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return SUB41(iVar2,0);
  }
  __stack_chk_fail();
}

Assistant:

bool InternalFilterPolicy::KeyMayMatch(const Slice& key, const Slice& f) const {
  return user_policy_->KeyMayMatch(ExtractUserKey(key), f);
}